

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

_Bool square_remove_all_traps_of_type(chunk_conflict2 *c,loc_conflict grid,wchar_t t_idx_remove)

{
  trap *trap_00;
  _Bool _Var1;
  _Bool _Var2;
  square_conflict *psVar3;
  trap *next_trap;
  trap *trap;
  trap *prev_trap;
  _Bool removed;
  wchar_t t_idx_remove_local;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  _Var1 = false;
  trap = (trap *)0x0;
  psVar3 = square((chunk *)c,grid);
  next_trap = psVar3->trap;
  while (next_trap != (trap *)0x0) {
    trap_00 = next_trap->next;
    if (t_idx_remove == (uint)next_trap->t_idx) {
      mem_free(next_trap);
      _Var1 = true;
      if (trap == (trap *)0x0) {
        square_set_trap((chunk *)c,grid,trap_00);
        next_trap = trap_00;
        if (trap_00 == (trap *)0x0) {
          psVar3 = square((chunk *)c,grid);
          flag_off(psVar3->info,3,9);
        }
      }
      else {
        trap->next = trap_00;
        next_trap = trap_00;
      }
    }
    else {
      trap = next_trap;
      next_trap = trap_00;
    }
  }
  if ((_Var1 != false) && (_Var2 = square_isseen((chunk *)c,grid), _Var2)) {
    square_memorize_traps(c,grid);
    square_light_spot((chunk *)c,(loc)grid);
  }
  return _Var1;
}

Assistant:

bool square_remove_all_traps_of_type(struct chunk *c, struct loc grid,
		int t_idx_remove)
{
	bool removed = false;

	/* Look at the traps in this grid */
	struct trap *prev_trap = NULL;
	struct trap *trap = square(c, grid)->trap;

	while (trap) {
		struct trap *next_trap = trap->next;

		if (t_idx_remove == trap->t_idx) {
			mem_free(trap);
			removed = true;

			if (prev_trap) {
				prev_trap->next = next_trap;
			} else {
				square_set_trap(c, grid, next_trap);
				if (!next_trap) {
					sqinfo_off(square(c, grid)->info,
						SQUARE_TRAP);
				}
			}
		} else {
			prev_trap = trap;
		}

		trap = next_trap;
	}

	/* Refresh grids that the character can see */
	if (removed && square_isseen(c, grid)) {
		square_memorize_traps(c, grid);
		square_light_spot(c, grid);
	}

	return removed;
}